

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMatrixSolver.cpp
# Opt level: O3

void __thiscall
TPZMatrixSolver<Fad<float>_>::Read(TPZMatrixSolver<Fad<float>_> *this,TPZStream *buf,void *context)

{
  TPZAutoPointer<TPZMatrix<Fad<float>_>_> local_30;
  TPZAutoPointer<TPZSavable> local_28;
  TPZAutoPointer<TPZSavable> local_20;
  
  TPZSavable::Read((TPZSavable *)this,buf,context);
  TPZPersistenceManager::GetAutoPointer((TPZPersistenceManager *)&local_20,buf);
  TPZAutoPointerDynamicCast<TPZMatrix<Fad<float>>,TPZSavable>
            ((TPZAutoPointer<TPZSavable> *)&local_30);
  TPZAutoPointer<TPZMatrix<Fad<float>_>_>::operator=(&this->fContainer,&local_30);
  TPZAutoPointer<TPZMatrix<Fad<float>_>_>::~TPZAutoPointer(&local_30);
  TPZAutoPointer<TPZSavable>::~TPZAutoPointer(&local_20);
  TPZPersistenceManager::GetAutoPointer((TPZPersistenceManager *)&local_28,buf);
  TPZAutoPointerDynamicCast<TPZMatrix<Fad<float>>,TPZSavable>
            ((TPZAutoPointer<TPZSavable> *)&local_30);
  TPZAutoPointer<TPZMatrix<Fad<float>_>_>::operator=(&this->fReferenceMatrix,&local_30);
  TPZAutoPointer<TPZMatrix<Fad<float>_>_>::~TPZAutoPointer(&local_30);
  TPZAutoPointer<TPZSavable>::~TPZAutoPointer(&local_28);
  return;
}

Assistant:

void TPZMatrixSolver<TVar>::Read(TPZStream &buf, void *context)
{
	TPZSolver::Read(buf,context);
	fContainer = TPZAutoPointerDynamicCast<TPZMatrix<TVar>>(TPZPersistenceManager::GetAutoPointer(&buf));
	fReferenceMatrix = TPZAutoPointerDynamicCast<TPZMatrix<TVar>>(TPZPersistenceManager::GetAutoPointer(&buf));
}